

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

bool __thiscall ON_Linetype::SetSegment(ON_Linetype *this,int index,double length,eSegType type)

{
  ON_LinetypeSegment *pOVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((-1 < index) && ((this->m_is_locked_bits & 1) == 0)) {
    if ((this->m_private->m_segments).m_count <= index) {
      return false;
    }
    pOVar1 = (this->m_private->m_segments).m_a;
    pOVar1[(uint)index].m_length = length;
    pOVar1[(uint)index].m_seg_type = type;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ON_Linetype::SetSegment( int index, double length, ON_LinetypeSegment::eSegType type)
{
  if (PatternIsLocked())
    return false;

  if( index >= 0 && index < m_private->m_segments.Count())
  {
    m_private->m_segments[index].m_length = length;
    m_private->m_segments[index].m_seg_type = type;
    return true;
  }
  else
    return false;
}